

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O2

void __thiscall wasm::EffectAnalyzer::EffectAnalyzer(EffectAnalyzer *this,EffectAnalyzer *param_1)

{
  Module *pMVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  size_t sVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined4 uVar17;
  
  bVar5 = param_1->trapsNeverHappen;
  this->ignoreImplicitTraps = param_1->ignoreImplicitTraps;
  this->trapsNeverHappen = bVar5;
  (this->funcEffectsMap).
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (param_1->funcEffectsMap).
           super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var3 = (param_1->funcEffectsMap).
           super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (param_1->funcEffectsMap).
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->funcEffectsMap).
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar2;
  (this->funcEffectsMap).
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var3;
  (param_1->funcEffectsMap).
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  pMVar1 = param_1->module;
  *(undefined8 *)((long)&this->module + 6) = *(undefined8 *)((long)&param_1->module + 6);
  this->module = pMVar1;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->localsRead)._M_t._M_impl.super__Rb_tree_header,
             &(param_1->localsRead)._M_t._M_impl.super__Rb_tree_header);
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->localsWritten)._M_t._M_impl.super__Rb_tree_header,
             &(param_1->localsWritten)._M_t._M_impl.super__Rb_tree_header);
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->mutableGlobalsRead)._M_t._M_impl.super__Rb_tree_header,
             &(param_1->mutableGlobalsRead)._M_t._M_impl.super__Rb_tree_header);
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->globalsWritten)._M_t._M_impl.super__Rb_tree_header,
             &(param_1->globalsWritten)._M_t._M_impl.super__Rb_tree_header);
  this->danglingPop = param_1->danglingPop;
  bVar5 = param_1->readsMemory;
  bVar6 = param_1->writesMemory;
  bVar7 = param_1->readsTable;
  bVar8 = param_1->writesTable;
  bVar9 = param_1->readsMutableStruct;
  bVar10 = param_1->writesStruct;
  bVar11 = param_1->readsArray;
  bVar12 = param_1->writesArray;
  bVar13 = param_1->trap;
  bVar14 = param_1->implicitTrap;
  bVar15 = param_1->isAtomic;
  bVar16 = param_1->throws_;
  uVar17 = *(undefined4 *)&param_1->field_0xf4;
  sVar4 = param_1->catchDepth;
  this->tryDepth = param_1->tryDepth;
  this->catchDepth = sVar4;
  this->readsMemory = bVar5;
  this->writesMemory = bVar6;
  this->readsTable = bVar7;
  this->writesTable = bVar8;
  this->readsMutableStruct = bVar9;
  this->writesStruct = bVar10;
  this->readsArray = bVar11;
  this->writesArray = bVar12;
  this->trap = bVar13;
  this->implicitTrap = bVar14;
  this->isAtomic = bVar15;
  this->throws_ = bVar16;
  *(undefined4 *)&this->field_0xf4 = uVar17;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->breakTargets)._M_t._M_impl.super__Rb_tree_header,
             &(param_1->breakTargets)._M_t._M_impl.super__Rb_tree_header);
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->delegateTargets)._M_t._M_impl.super__Rb_tree_header,
             &(param_1->delegateTargets)._M_t._M_impl.super__Rb_tree_header);
  return;
}

Assistant:

EffectAnalyzer(const PassOptions& passOptions, Module& module)
    : ignoreImplicitTraps(passOptions.ignoreImplicitTraps),
      trapsNeverHappen(passOptions.trapsNeverHappen),
      funcEffectsMap(passOptions.funcEffectsMap), module(module),
      features(module.features) {}